

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::ShowPlotContextMenu(ImPlotPlot *plot)

{
  bool bVar1;
  ImPlotAxis *local_98;
  ImPlotAxis *local_88;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  float local_28;
  char local_22 [2];
  float s;
  char buf [10];
  int i;
  bool equal;
  ImPlotPlot *plot_local;
  
  buf[9] = ImHasFlag<int,ImPlotFlags_>(plot->Flags,ImPlotFlags_Equal);
  bVar1 = ImGui::BeginMenu("X-Axis",true);
  if (bVar1) {
    ImGui::PushID("X");
    if ((buf[9] & 1U) == 0) {
      local_88 = (ImPlotAxis *)0x0;
    }
    else {
      local_88 = plot->YAxis;
    }
    ShowAxisContextMenu(&plot->XAxis,local_88,true);
    ImGui::PopID();
    ImGui::EndMenu();
  }
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  for (; (int)buf._2_4_ < 3; buf._2_4_ = buf._2_4_ + 1) {
    if (((buf._2_4_ != 1) ||
        (bVar1 = ImHasFlag<int,ImPlotFlags_>(plot->Flags,ImPlotFlags_YAxis2), bVar1)) &&
       ((buf._2_4_ != 2 ||
        (bVar1 = ImHasFlag<int,ImPlotFlags_>(plot->Flags,ImPlotFlags_YAxis3), bVar1)))) {
      memset(local_22,0,10);
      if (buf._2_4_ == 0) {
        snprintf(local_22,9,"Y-Axis");
      }
      else {
        snprintf(local_22,9,"Y-Axis %d",(ulong)(buf._2_4_ + 1));
      }
      bVar1 = ImGui::BeginMenu(local_22,true);
      if (bVar1) {
        ImGui::PushID(buf._2_4_);
        if (((buf[9] & 1U) == 0) || (buf._2_4_ != 0)) {
          local_98 = (ImPlotAxis *)0x0;
        }
        else {
          local_98 = &plot->XAxis;
        }
        ShowAxisContextMenu(plot->YAxis + (int)buf._2_4_,local_98,false);
        ImGui::PopID();
        ImGui::EndMenu();
      }
    }
  }
  ImGui::Separator();
  bVar1 = ImGui::BeginMenu("Settings",true);
  if (bVar1) {
    bVar1 = ImHasFlag<int,ImPlotFlags_>(plot->Flags,ImPlotFlags_AntiAliased);
    bVar1 = ImGui::MenuItem("Anti-Aliased Lines",(char *)0x0,bVar1,true);
    if (bVar1) {
      ImFlipFlag<int,ImPlotFlags_>(&plot->Flags,ImPlotFlags_AntiAliased);
    }
    bVar1 = ImHasFlag<int,ImPlotFlags_>(plot->Flags,ImPlotFlags_Equal);
    bVar1 = ImGui::MenuItem("Equal",(char *)0x0,bVar1,true);
    if (bVar1) {
      ImFlipFlag<int,ImPlotFlags_>(&plot->Flags,ImPlotFlags_Equal);
    }
    bVar1 = ImHasFlag<int,ImPlotFlags_>(plot->Flags,ImPlotFlags_NoBoxSelect);
    bVar1 = ImGui::MenuItem("Box Select",(char *)0x0,(bool)((bVar1 ^ 0xffU) & 1),true);
    if (bVar1) {
      ImFlipFlag<int,ImPlotFlags_>(&plot->Flags,ImPlotFlags_NoBoxSelect);
    }
    bVar1 = ImHasFlag<int,ImPlotFlags_>(plot->Flags,ImPlotFlags_Query);
    bVar1 = ImGui::MenuItem("Query",(char *)0x0,bVar1,true);
    if (bVar1) {
      ImFlipFlag<int,ImPlotFlags_>(&plot->Flags,ImPlotFlags_Query);
    }
    bVar1 = ImHasFlag<int,ImPlotFlags_>(plot->Flags,ImPlotFlags_NoTitle);
    bVar1 = ImGui::MenuItem("Title",(char *)0x0,(bool)((bVar1 ^ 0xffU) & 1),true);
    if (bVar1) {
      ImFlipFlag<int,ImPlotFlags_>(&plot->Flags,ImPlotFlags_NoTitle);
    }
    bVar1 = ImHasFlag<int,ImPlotFlags_>(plot->Flags,ImPlotFlags_NoMousePos);
    bVar1 = ImGui::MenuItem("Mouse Position",(char *)0x0,(bool)((bVar1 ^ 0xffU) & 1),true);
    if (bVar1) {
      ImFlipFlag<int,ImPlotFlags_>(&plot->Flags,ImPlotFlags_NoMousePos);
    }
    bVar1 = ImHasFlag<int,ImPlotFlags_>(plot->Flags,ImPlotFlags_Crosshairs);
    bVar1 = ImGui::MenuItem("Crosshairs",(char *)0x0,bVar1,true);
    if (bVar1) {
      ImFlipFlag<int,ImPlotFlags_>(&plot->Flags,ImPlotFlags_Crosshairs);
    }
    bVar1 = ImGui::BeginMenu("Legend",true);
    if (bVar1) {
      local_28 = ImGui::GetFrameHeight();
      bVar1 = ImGui::RadioButton("H",plot->LegendOrientation == 0);
      if (bVar1) {
        plot->LegendOrientation = 0;
      }
      ImGui::SameLine(0.0,-1.0);
      bVar1 = ImGui::RadioButton("V",plot->LegendOrientation == 1);
      if (bVar1) {
        plot->LegendOrientation = 1;
      }
      ImGui::Checkbox("Outside",&plot->LegendOutside);
      ImVec2::ImVec2(&local_30,1.0,1.0);
      ImGui::PushStyleVar(0xd,&local_30);
      ImVec2::ImVec2(&local_38,local_28 * 1.5,local_28);
      bVar1 = ImGui::Button("##NW",&local_38);
      if (bVar1) {
        plot->LegendLocation = 5;
      }
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_40,local_28 * 1.5,local_28);
      bVar1 = ImGui::Button("##N",&local_40);
      if (bVar1) {
        plot->LegendLocation = 1;
      }
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_48,local_28 * 1.5,local_28);
      bVar1 = ImGui::Button("##NE",&local_48);
      if (bVar1) {
        plot->LegendLocation = 9;
      }
      ImVec2::ImVec2(&local_50,local_28 * 1.5,local_28);
      bVar1 = ImGui::Button("##W",&local_50);
      if (bVar1) {
        plot->LegendLocation = 4;
      }
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_58,local_28 * 1.5,local_28);
      bVar1 = ImGui::Button("##C",&local_58);
      if (bVar1) {
        plot->LegendLocation = 0;
      }
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_60,local_28 * 1.5,local_28);
      bVar1 = ImGui::Button("##E",&local_60);
      if (bVar1) {
        plot->LegendLocation = 8;
      }
      ImVec2::ImVec2(&local_68,local_28 * 1.5,local_28);
      bVar1 = ImGui::Button("##SW",&local_68);
      if (bVar1) {
        plot->LegendLocation = 6;
      }
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_70,local_28 * 1.5,local_28);
      bVar1 = ImGui::Button("##S",&local_70);
      if (bVar1) {
        plot->LegendLocation = 2;
      }
      ImGui::SameLine(0.0,-1.0);
      ImVec2::ImVec2(&local_78,local_28 * 1.5,local_28);
      bVar1 = ImGui::Button("##SE",&local_78);
      if (bVar1) {
        plot->LegendLocation = 10;
      }
      ImGui::PopStyleVar(1);
      ImGui::EndMenu();
    }
    ImGui::EndMenu();
  }
  bVar1 = ImHasFlag<int,ImPlotFlags_>(plot->Flags,ImPlotFlags_NoLegend);
  bVar1 = ImGui::MenuItem("Legend",(char *)0x0,(bool)((bVar1 ^ 0xffU) & 1),true);
  if (bVar1) {
    ImFlipFlag<int,ImPlotFlags_>(&plot->Flags,ImPlotFlags_NoLegend);
  }
  return;
}

Assistant:

void ShowPlotContextMenu(ImPlotPlot& plot) {
    const bool equal = ImHasFlag(plot.Flags, ImPlotFlags_Equal);
    if (ImGui::BeginMenu("X-Axis")) {
        ImGui::PushID("X");
        ShowAxisContextMenu(plot.XAxis, equal ? &plot.YAxis[0] : NULL, true);
        ImGui::PopID();
        ImGui::EndMenu();
    }
    for (int i = 0; i < IMPLOT_Y_AXES; i++) {
        if (i == 1 && !ImHasFlag(plot.Flags, ImPlotFlags_YAxis2)) {
            continue;
        }
        if (i == 2 && !ImHasFlag(plot.Flags, ImPlotFlags_YAxis3)) {
            continue;
        }
        char buf[10] = {};
        if (i == 0) {
            snprintf(buf, sizeof(buf) - 1, "Y-Axis");
        } else {
            snprintf(buf, sizeof(buf) - 1, "Y-Axis %d", i + 1);
        }
        if (ImGui::BeginMenu(buf)) {
            ImGui::PushID(i);
            ShowAxisContextMenu(plot.YAxis[i], (equal && i == 0) ? &plot.XAxis : NULL, false);
            ImGui::PopID();
            ImGui::EndMenu();
        }
    }

    ImGui::Separator();
    if ((ImGui::BeginMenu("Settings"))) {
        if (ImGui::MenuItem("Anti-Aliased Lines",NULL,ImHasFlag(plot.Flags, ImPlotFlags_AntiAliased)))
            ImFlipFlag(plot.Flags, ImPlotFlags_AntiAliased);
        if (ImGui::MenuItem("Equal", NULL, ImHasFlag(plot.Flags, ImPlotFlags_Equal)))
            ImFlipFlag(plot.Flags, ImPlotFlags_Equal);
        if (ImGui::MenuItem("Box Select",NULL,!ImHasFlag(plot.Flags, ImPlotFlags_NoBoxSelect)))
            ImFlipFlag(plot.Flags, ImPlotFlags_NoBoxSelect);
        if (ImGui::MenuItem("Query",NULL,ImHasFlag(plot.Flags, ImPlotFlags_Query)))
            ImFlipFlag(plot.Flags, ImPlotFlags_Query);
        if (ImGui::MenuItem("Title",NULL,!ImHasFlag(plot.Flags, ImPlotFlags_NoTitle)))
            ImFlipFlag(plot.Flags, ImPlotFlags_NoTitle);
        if (ImGui::MenuItem("Mouse Position",NULL,!ImHasFlag(plot.Flags, ImPlotFlags_NoMousePos)))
            ImFlipFlag(plot.Flags, ImPlotFlags_NoMousePos);
        if (ImGui::MenuItem("Crosshairs",NULL,ImHasFlag(plot.Flags, ImPlotFlags_Crosshairs)))
            ImFlipFlag(plot.Flags, ImPlotFlags_Crosshairs);
        if ((ImGui::BeginMenu("Legend"))) {
            const float s = ImGui::GetFrameHeight();
            if (ImGui::RadioButton("H", plot.LegendOrientation == ImPlotOrientation_Horizontal))
                plot.LegendOrientation = ImPlotOrientation_Horizontal;
            ImGui::SameLine();
            if (ImGui::RadioButton("V", plot.LegendOrientation == ImPlotOrientation_Vertical))
                plot.LegendOrientation = ImPlotOrientation_Vertical;
            ImGui::Checkbox("Outside", &plot.LegendOutside);
            ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(1,1));
            if (ImGui::Button("##NW",ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_NorthWest; } ImGui::SameLine();
            if (ImGui::Button("##N", ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_North;     } ImGui::SameLine();
            if (ImGui::Button("##NE",ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_NorthEast; }
            if (ImGui::Button("##W", ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_West;      } ImGui::SameLine();
            if (ImGui::Button("##C", ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_Center;    } ImGui::SameLine();
            if (ImGui::Button("##E", ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_East;      }
            if (ImGui::Button("##SW",ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_SouthWest; } ImGui::SameLine();
            if (ImGui::Button("##S", ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_South;     } ImGui::SameLine();
            if (ImGui::Button("##SE",ImVec2(1.5f*s,s))) { plot.LegendLocation = ImPlotLocation_SouthEast; }
            ImGui::PopStyleVar();
            ImGui::EndMenu();
        }
        ImGui::EndMenu();
    }
    if (ImGui::MenuItem("Legend",NULL,!ImHasFlag(plot.Flags, ImPlotFlags_NoLegend))) {
        ImFlipFlag(plot.Flags, ImPlotFlags_NoLegend);
    }
}